

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SGDOptimizer::SGDOptimizer(SGDOptimizer *this,SGDOptimizer *from)

{
  void *pvVar1;
  DoubleParameter *pDVar2;
  Int64Parameter *from_00;
  DoubleParameter *pDVar3;
  Int64Parameter *this_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SGDOptimizer_0039ba70;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pDVar2 = from->learningrate_;
  if (pDVar2 == (DoubleParameter *)0x0 || from == (SGDOptimizer *)&_SGDOptimizer_default_instance_)
  {
    pDVar3 = (DoubleParameter *)0x0;
  }
  else {
    pDVar3 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar3,pDVar2);
  }
  this->learningrate_ = pDVar3;
  from_00 = from->minibatchsize_;
  if (from_00 == (Int64Parameter *)0x0 || from == (SGDOptimizer *)&_SGDOptimizer_default_instance_)
  {
    this_00 = (Int64Parameter *)0x0;
  }
  else {
    this_00 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(this_00,from_00);
  }
  this->minibatchsize_ = this_00;
  pDVar2 = from->momentum_;
  if (pDVar2 == (DoubleParameter *)0x0 || from == (SGDOptimizer *)&_SGDOptimizer_default_instance_)
  {
    pDVar3 = (DoubleParameter *)0x0;
  }
  else {
    pDVar3 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar3,pDVar2);
  }
  this->momentum_ = pDVar3;
  return;
}

Assistant:

SGDOptimizer::SGDOptimizer(const SGDOptimizer& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_learningrate()) {
    learningrate_ = new ::CoreML::Specification::DoubleParameter(*from.learningrate_);
  } else {
    learningrate_ = NULL;
  }
  if (from.has_minibatchsize()) {
    minibatchsize_ = new ::CoreML::Specification::Int64Parameter(*from.minibatchsize_);
  } else {
    minibatchsize_ = NULL;
  }
  if (from.has_momentum()) {
    momentum_ = new ::CoreML::Specification::DoubleParameter(*from.momentum_);
  } else {
    momentum_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SGDOptimizer)
}